

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eq_Pos_Table.cpp
# Opt level: O2

vector<Position,_std::allocator<Position>_> * __thiscall
Eq_Pos_Table::get_equivalent_positions
          (vector<Position,_std::allocator<Position>_> *__return_storage_ptr__,Eq_Pos_Table *this,
          Color center_color,int flat_entry)

{
  vector<Position,_std::allocator<Position>_> *extraout_RAX;
  char *pcVar1;
  
  switch(center_color) {
  case green:
    this = (Eq_Pos_Table *)&this->green_eq;
    break;
  case blue:
    break;
  case yellow:
    this = (Eq_Pos_Table *)&this->yellow_eq;
    break;
  case red:
    this = (Eq_Pos_Table *)&this->red_eq;
    break;
  default:
    pcVar1 = "Invalid color";
    puts("Invalid color");
    pcVar1[0x10] = '\0';
    pcVar1[0x11] = '\0';
    pcVar1[0x12] = '\0';
    pcVar1[0x13] = '\0';
    pcVar1[0x14] = '\0';
    pcVar1[0x15] = '\0';
    pcVar1[0x16] = '\0';
    pcVar1[0x17] = '\0';
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    pcVar1[4] = '\0';
    pcVar1[5] = '\0';
    pcVar1[6] = '\0';
    pcVar1[7] = '\0';
    pcVar1[8] = '\0';
    pcVar1[9] = '\0';
    pcVar1[10] = '\0';
    pcVar1[0xb] = '\0';
    pcVar1[0xc] = '\0';
    pcVar1[0xd] = '\0';
    pcVar1[0xe] = '\0';
    pcVar1[0xf] = '\0';
    std::vector<Position,std::allocator<Position>>::_M_range_initialize<Position_const*>();
    return extraout_RAX;
  }
  std::vector<Position,_std::allocator<Position>_>::vector
            (__return_storage_ptr__,
             (this->blue_eq).
             super__Vector_base<std::vector<Position,_std::allocator<Position>_>,_std::allocator<std::vector<Position,_std::allocator<Position>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + flat_entry);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Position> Eq_Pos_Table::get_equivalent_positions(Color center_color, int flat_entry){
    switch (center_color)
    {
    case Color::blue:
        return blue_eq[flat_entry];
        break;
    case Color::yellow:
        return yellow_eq[flat_entry];
        break;
    case Color::red:
        return red_eq[flat_entry];
        break;
    case Color::green:
        return green_eq[flat_entry];
        break;
    default:
        printf("Invalid color\n");
        break;
    }
}